

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_31(QPDF *pdf,char *arg2)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  QPDFObjectHandle o2;
  QPDFObjectHandle o1;
  long *local_d8 [2];
  long local_c8 [2];
  QPDF local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long local_78 [2];
  string local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  char local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  operator____qpdf(local_58,0x1482bf);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_a8,local_a0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"   12345 \f  ","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
  QPDFObjectHandle::parse(local_68,(string *)&local_a8);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  cVar1 = QPDFObjectHandle::isInteger();
  if (cVar1 != '\0') {
    lVar4 = QPDFObjectHandle::getIntValue();
    if (lVar4 == 0x3039) {
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"[1 0 R]","");
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"indirect test","");
      QPDFObjectHandle::parse(local_38,(string *)&local_a8);
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"oops -- didn\'t throw",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"0 trailing","");
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"trailing test","");
      QPDFObjectHandle::parse(local_48,(string *)&local_a8);
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"oops -- didn\'t throw",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"[5 0 R]","");
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
      QPDFObjectHandle::parse(local_b8,(string *)pdf,(string *)&local_a8);
      QPDFObjectHandle::getArrayItem((int)&local_88);
      cVar1 = QPDFObjectHandle::isInteger();
      if (cVar1 == '\0') {
        __assert_fail("QPDFObjectHandle::parse(&pdf, \"[5 0 R]\").getArrayItem(0).isInteger()",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4a6,"void test_31(QPDF &, const char *)");
      }
      if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
      }
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"[5 0 R]","");
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
      QPDFObjectHandle::parse(local_b8,(string *)pdf,(string *)&local_a8);
      QPDFObjectHandle::getArrayItem((int)&local_88);
      cVar1 = QPDFObjectHandle::isDirectNull();
      if (cVar1 != '\0') {
        __assert_fail("!QPDFObjectHandle::parse(&pdf, \"[5 0 R]\").getArrayItem(0).isDirectNull()",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4a7,"void test_31(QPDF &, const char *)");
      }
      if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
      }
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"[5 0 R 0 R /X]","");
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
      QPDFObjectHandle::parse(local_b8,(string *)pdf,(string *)local_d8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar2 != 0) {
        __assert_fail("QPDFObjectHandle::parse(&pdf, \"[5 0 R 0 R /X]\").unparse() == \"[ 5 0 R 0 (R) /X ]\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4aa,"void test_31(QPDF &, const char *)");
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"[1 0 R]","");
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"indirect test","");
      QPDFObjectHandle::parse(local_b8,(string *)pdf,(string *)local_d8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar2 != 0) {
        __assert_fail("QPDFObjectHandle::parse(&pdf, \"[1 0 R]\", \"indirect test\").unparse() == \"[ 1 0 R ]\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4ab,"void test_31(QPDF &, const char *)");
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"}","");
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
      QPDFObjectHandle::parse(local_b8,(string *)pdf,(string *)local_d8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar2 != 0) {
        __assert_fail("QPDFObjectHandle::parse(&pdf, \"}\").unparse() == \"null\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4ad,"void test_31(QPDF &, const char *)");
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"{","");
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
      QPDFObjectHandle::parse(local_b8,(string *)pdf,(string *)local_d8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar2 == 0) {
        if (local_a8 != local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
        }
        if (local_88 != local_78) {
          operator_delete(local_88,local_78[0] + 1);
        }
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0],local_c8[0] + 1);
        }
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,">>","");
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
        QPDFObjectHandle::parse(local_b8,(string *)pdf,(string *)local_d8);
        QPDFObjectHandle::unparse_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar2 != 0) {
          __assert_fail("QPDFObjectHandle::parse(&pdf, \">>\").unparse() == \"null\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x4b0,"void test_31(QPDF &, const char *)");
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
        }
        if (local_88 != local_78) {
          operator_delete(local_88,local_78[0] + 1);
        }
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0],local_c8[0] + 1);
        }
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"[7 0 R]","");
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
        QPDFObjectHandle::parse(local_b8,(string *)pdf,(string *)&local_a8);
        QPDFObjectHandle::getArrayItem((int)&local_88);
        cVar1 = QPDFObjectHandle::isNull();
        if (cVar1 == '\0') {
          __assert_fail("QPDFObjectHandle::parse(&pdf, \"[7 0 R]\").getArrayItem(0).isNull()",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x4b2,"void test_31(QPDF &, const char *)");
        }
        if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
        }
        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
        }
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0],local_c8[0] + 1);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"[7 0 R]","");
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
        QPDFObjectHandle::parse(local_b8,(string *)pdf,(string *)&local_a8);
        QPDFObjectHandle::getArrayItem((int)&local_88);
        cVar1 = QPDFObjectHandle::isDirectNull();
        if (cVar1 != '\0') {
          __assert_fail("!QPDFObjectHandle::parse(&pdf, \"[7 0 R]\").getArrayItem(0).isDirectNull()"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x4b3,"void test_31(QPDF &, const char *)");
        }
        if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
        }
        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
        }
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0],local_c8[0] + 1);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"null","");
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
        QPDFObjectHandle::parse((QPDF *)&local_88,(string *)pdf,(string *)&local_a8);
        cVar1 = QPDFObjectHandle::isDirectNull();
        if (cVar1 != '\0') {
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
          if (local_d8[0] != local_c8) {
            operator_delete(local_d8[0],local_c8[0] + 1);
          }
          if (local_a8 != local_98) {
            operator_delete(local_a8,local_98[0] + 1);
          }
          local_d8[0] = local_c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"[0 0 R -1 0 R 1 65535 R 1 100000 R 1 -1 R]","");
          local_88 = local_78;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
          QPDFObjectHandle::parse(local_b8,(string *)pdf,(string *)local_d8);
          QPDFObjectHandle::unparse_abi_cxx11_();
          iVar2 = std::__cxx11::string::compare((char *)&local_a8);
          if (iVar2 == 0) {
            if (local_a8 != local_98) {
              operator_delete(local_a8,local_98[0] + 1);
            }
            if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
            }
            if (local_88 != local_78) {
              operator_delete(local_88,local_78[0] + 1);
            }
            if (local_d8[0] != local_c8) {
              operator_delete(local_d8[0],local_c8[0] + 1);
            }
            if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
            }
            if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
            }
            return;
          }
          __assert_fail("QPDFObjectHandle::parse(&pdf, \"[0 0 R -1 0 R 1 65535 R 1 100000 R 1 -1 R]\").unparse() == \"[ null null null null null ]\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x4b8,"void test_31(QPDF &, const char *)");
        }
        __assert_fail("QPDFObjectHandle::parse(&pdf, \"null\").isDirectNull()",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4b4,"void test_31(QPDF &, const char *)");
      }
      __assert_fail("QPDFObjectHandle::parse(&pdf, \"{\").unparse() == \"null\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x4ae,"void test_31(QPDF &, const char *)");
    }
  }
  __assert_fail("o2.isInteger() && (o2.getIntValue() == 12345)",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x499,"void test_31(QPDF &, const char *)");
}

Assistant:

static void
test_31(QPDF& pdf, char const* arg2)
{
    auto o1 = "[/name 16059 3.14159 false\n"
              " << /key true /other [ (string1) (string2) ] >> null]"_qpdf;
    std::cout << o1.unparse() << std::endl;
    QPDFObjectHandle o2 = QPDFObjectHandle::parse("   12345 \f  ");
    assert(o2.isInteger() && (o2.getIntValue() == 12345));
    try {
        QPDFObjectHandle::parse("[1 0 R]", "indirect test");
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error parsing indirect: " << e.what() << std::endl;
    }
    try {
        QPDFObjectHandle::parse("0 trailing", "trailing test");
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::runtime_error const& e) {
        std::cout << "trailing data: " << e.what() << std::endl;
    }
    assert(QPDFObjectHandle::parse(&pdf, "[5 0 R]").getArrayItem(0).isInteger());
    assert(!QPDFObjectHandle::parse(&pdf, "[5 0 R]").getArrayItem(0).isDirectNull());
    // Make sure an indirect integer followed by "0 R" is not
    // mistakenly parsed as an indirect object.
    assert(QPDFObjectHandle::parse(&pdf, "[5 0 R 0 R /X]").unparse() == "[ 5 0 R 0 (R) /X ]");
    assert(QPDFObjectHandle::parse(&pdf, "[1 0 R]", "indirect test").unparse() == "[ 1 0 R ]");
    // TC:QPDFParser bad brace
    assert(QPDFObjectHandle::parse(&pdf, "}").unparse() == "null");
    assert(QPDFObjectHandle::parse(&pdf, "{").unparse() == "null");
    // TC:QPDFParser bad dictionary close
    assert(QPDFObjectHandle::parse(&pdf, ">>").unparse() == "null");
    // TC:QPDFParser eof in parse
    assert(QPDFObjectHandle::parse(&pdf, "[7 0 R]").getArrayItem(0).isNull());
    assert(!QPDFObjectHandle::parse(&pdf, "[7 0 R]").getArrayItem(0).isDirectNull());
    assert(QPDFObjectHandle::parse(&pdf, "null").isDirectNull());
    // TC:QPDFParser invalid objgen
    assert(
        QPDFObjectHandle::parse(&pdf, "[0 0 R -1 0 R 1 65535 R 1 100000 R 1 -1 R]").unparse() ==
        "[ null null null null null ]");
}